

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O1

void __thiscall FASTEXP_PowerZero_Test::TestBody(FASTEXP_PowerZero_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<long_long> __l;
  initializer_list<long_long> __l_00;
  longlong local_88 [3];
  vector<long_long,_std::allocator<long_long>_> local_70;
  AssertHelper local_58;
  undefined8 local_50;
  undefined8 local_48;
  internal local_40 [8];
  AssertionResult gtest_ar;
  allocator_type local_12;
  allocator_type local_11;
  
  local_58.data_ = (AssertHelperData *)0x1;
  local_50 = 1;
  local_48 = 1;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_58;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,__l,&local_12);
  local_88[0] = 1;
  local_88[1] = 1;
  local_88[2] = 1;
  __l_00._M_len = 3;
  __l_00._M_array = local_88;
  std::vector<long_long,_std::allocator<long_long>_>::vector(&local_70,__l_00,&local_11);
  testing::internal::
  CmpHelperEQ<std::vector<long_long,std::allocator<long_long>>,std::vector<long_long,std::allocator<long_long>>>
            (local_40,
             "(vector<ll> {fastexp(1, 0, 5), fastexp(10, 0, 62853), fastexp(1247393725, 0, 523492342)})"
             ,"(vector<ll> {1, 1, 1})",
             (vector<long_long,_std::allocator<long_long>_> *)&gtest_ar.message_,&local_70);
  if (local_70.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,10,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(FASTEXP, PowerZero) {
	EXPECT_EQ((vector<ll> {fastexp(1, 0, 5), fastexp(10, 0, 62853), fastexp(1247393725, 0, 523492342)}), (vector<ll> {1, 1, 1}));
}